

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.h
# Opt level: O0

_Bool tpl_alloc_temp_buffers(TplBuffers *tpl_tmp_buffers,uint8_t tpl_bsize_1d)

{
  void *pvVar1;
  long *in_RDI;
  int tpl_block_pels;
  _Bool local_1;
  
  pvVar1 = aom_memalign((size_t)tpl_tmp_buffers,CONCAT17(tpl_bsize_1d,_tpl_block_pels));
  *in_RDI = (long)pvVar1;
  pvVar1 = aom_memalign((size_t)tpl_tmp_buffers,CONCAT17(tpl_bsize_1d,_tpl_block_pels));
  in_RDI[1] = (long)pvVar1;
  pvVar1 = aom_memalign((size_t)tpl_tmp_buffers,CONCAT17(tpl_bsize_1d,_tpl_block_pels));
  in_RDI[2] = (long)pvVar1;
  pvVar1 = aom_memalign((size_t)tpl_tmp_buffers,CONCAT17(tpl_bsize_1d,_tpl_block_pels));
  in_RDI[3] = (long)pvVar1;
  pvVar1 = aom_memalign((size_t)tpl_tmp_buffers,CONCAT17(tpl_bsize_1d,_tpl_block_pels));
  in_RDI[4] = (long)pvVar1;
  if ((((*in_RDI == 0) || (in_RDI[1] == 0)) || (in_RDI[2] == 0)) ||
     ((in_RDI[3] == 0 || (in_RDI[4] == 0)))) {
    tpl_dealloc_temp_buffers((TplBuffers *)0x30fb3d);
    local_1 = false;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

static inline bool tpl_alloc_temp_buffers(TplBuffers *tpl_tmp_buffers,
                                          uint8_t tpl_bsize_1d) {
  // Number of pixels in a tpl block
  const int tpl_block_pels = tpl_bsize_1d * tpl_bsize_1d;

  // Allocate temporary buffers used in mode estimation.
  tpl_tmp_buffers->predictor8 = (uint8_t *)aom_memalign(
      32, tpl_block_pels * 2 * sizeof(*tpl_tmp_buffers->predictor8));
  tpl_tmp_buffers->src_diff = (int16_t *)aom_memalign(
      32, tpl_block_pels * sizeof(*tpl_tmp_buffers->src_diff));
  tpl_tmp_buffers->coeff = (tran_low_t *)aom_memalign(
      32, tpl_block_pels * sizeof(*tpl_tmp_buffers->coeff));
  tpl_tmp_buffers->qcoeff = (tran_low_t *)aom_memalign(
      32, tpl_block_pels * sizeof(*tpl_tmp_buffers->qcoeff));
  tpl_tmp_buffers->dqcoeff = (tran_low_t *)aom_memalign(
      32, tpl_block_pels * sizeof(*tpl_tmp_buffers->dqcoeff));

  if (!(tpl_tmp_buffers->predictor8 && tpl_tmp_buffers->src_diff &&
        tpl_tmp_buffers->coeff && tpl_tmp_buffers->qcoeff &&
        tpl_tmp_buffers->dqcoeff)) {
    tpl_dealloc_temp_buffers(tpl_tmp_buffers);
    return false;
  }
  return true;
}